

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O2

int FindMode(int seqnum,int mode)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  FName local_4;
  
  if (0 < seqnum) {
    iVar1 = Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[(uint)seqnum]->Script
            [0];
    if ((char)iVar1 == '\x10') {
      uVar3 = iVar1 >> 8;
      uVar5 = 0;
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar4 = uVar5;
      }
      do {
        if (uVar4 == uVar5) {
          return seqnum;
        }
        lVar2 = uVar5 * 2;
        uVar5 = uVar5 + 1;
      } while (Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[(uint)seqnum][1].
               Script[lVar2 + -3] != mode);
      seqnum = FindSequence(&local_4);
    }
  }
  return seqnum;
}

Assistant:

static int FindMode(int seqnum, int mode)
{
	if (seqnum <= 0)
	{ // Sequence does not exist.
		return seqnum;
	}
	FSoundSequence *seq = Sequences[seqnum];
	if (GetCommand(seq->Script[0]) != SS_CMD_SELECT)
	{ // This sequence doesn't select any others.
		return seqnum;
	}
	// Search for the desired mode amongst the selections
	int nummodes = GetData(seq->Script[0]);
	for (int i = 0; i < nummodes; ++i)
	{
		if (seq->Script[1 + i*2] == mode)
		{
			return FindSequence(ENamedName(seq->Script[1 + i*2 + 1]));
		}
	}
	// The mode isn't selected, which means it stays on this sequence.
	return seqnum;
}